

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O2

ProStringList * __thiscall
QMakeEvaluator::values
          (ProStringList *__return_storage_ptr__,QMakeEvaluator *this,ProKey *variableName)

{
  bool bVar1;
  bool bVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  _List_node_base *p_Var5;
  
  p_Var5 = (_List_node_base *)&this->m_valuemapStack;
  bVar1 = true;
  while( true ) {
    bVar2 = bVar1;
    p_Var5 = p_Var5->_M_prev;
    cVar3 = QMap<ProKey,_ProStringList>::find
                      ((QMap<ProKey,_ProStringList> *)(p_Var5 + 1),variableName);
    cVar4._M_node = (_Base_ptr)p_Var5[1]._M_next;
    if (cVar4._M_node != (_Base_ptr)0x0) {
      cVar4._M_node = (_Base_ptr)&(cVar4._M_node)->_M_left;
    }
    if (cVar3.i._M_node != (const_iterator)cVar4._M_node) break;
    if (p_Var5 == (this->m_valuemapStack).
                  super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                  .
                  super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next) goto LAB_001f5e2d;
    bVar1 = false;
    if (bVar2) {
      bVar2 = isFunctParam(variableName);
      bVar1 = false;
      if (bVar2) {
LAB_001f5e2d:
        (__return_storage_ptr__->super_QList<ProString>).d.d = (Data *)0x0;
        (__return_storage_ptr__->super_QList<ProString>).d.ptr = (ProString *)0x0;
        (__return_storage_ptr__->super_QList<ProString>).d.size = 0;
        return __return_storage_ptr__;
      }
    }
  }
  if (*(long *)((long)cVar3.i._M_node + 0x58) != QMakeInternal::statics._608_8_) {
    QArrayDataPointer<ProString>::QArrayDataPointer
              ((QArrayDataPointer<ProString> *)__return_storage_ptr__,
               (QArrayDataPointer<ProString> *)((long)cVar3.i._M_node + 0x50));
    return __return_storage_ptr__;
  }
  goto LAB_001f5e2d;
}

Assistant:

ProStringList QMakeEvaluator::values(const ProKey &variableName) const
{
    ProValueMapStack::const_iterator vmi = m_valuemapStack.cend();
    for (bool first = true; ; first = false) {
        --vmi;
        ProValueMap::ConstIterator it = (*vmi).constFind(variableName);
        if (it != (*vmi).constEnd()) {
            if (it->constBegin() == statics.fakeValue.constBegin())
                break;
            return *it;
        }
        if (vmi == m_valuemapStack.cbegin())
            break;
        if (first && isFunctParam(variableName))
            break;
    }
    return ProStringList();
}